

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O3

int uv_tty_init(uv_loop_t *loop,uv_tty_t *tty,int fd,int unused)

{
  uv_handle_type uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  uint uVar6;
  uint uVar7;
  char path [256];
  char acStack_138 [264];
  
  uVar1 = uv_guess_handle(fd);
  iVar3 = -0x16;
  if ((uVar1 != UV_UNKNOWN_HANDLE) && (uVar1 != UV_FILE)) {
    do {
      uVar2 = fcntl(fd,3);
      if (uVar2 != 0xffffffff) {
        uVar2 = uVar2 & 3;
        iVar3 = fd;
        if (uVar1 == UV_TTY) {
          iVar3 = ioctl(fd,0x80045430,acStack_138);
          if (((iVar3 != 0) && (iVar3 = ttyname_r(fd,acStack_138,0x100), iVar3 == 0)) &&
             (iVar3 = uv__open_cloexec(acStack_138,uVar2 + 0x100), -1 < iVar3)) {
            iVar4 = uv__dup2_cloexec(iVar3,fd);
            if (iVar4 != -0x16 && iVar4 < 0) {
              uv__close(iVar3);
              return iVar4;
            }
            goto LAB_0070c472;
          }
          uv__stream_init(loop,(uv_stream_t *)tty,UV_TTY);
          uVar6 = 0x100000;
          if (uVar2 != 0) goto LAB_0070c490;
        }
        else {
LAB_0070c472:
          uv__stream_init(loop,(uv_stream_t *)tty,UV_TTY);
          fd = iVar3;
        }
        uv__nonblock_ioctl(fd,1);
        uVar6 = 0;
LAB_0070c490:
        uVar7 = uVar6;
        if (uVar2 != 1) {
          uVar7 = uVar6 | 0x4000;
        }
        uVar7 = uVar7 | 0x8000;
        if (uVar2 == 0) {
          uVar7 = uVar6 | 0x4000;
        }
        uv__stream_open((uv_stream_t *)tty,fd,uVar7);
        tty->mode = 0;
        return 0;
      }
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
    iVar3 = -*piVar5;
  }
  return iVar3;
}

Assistant:

int uv_tty_init(uv_loop_t* loop, uv_tty_t* tty, int fd, int unused) {
  uv_handle_type type;
  int flags = 0;
  int newfd = -1;
  int r;
  int saved_flags;
  int mode;
  char path[256];
  (void)unused; /* deprecated parameter is no longer needed */

  /* File descriptors that refer to files cannot be monitored with epoll.
   * That restriction also applies to character devices like /dev/random
   * (but obviously not /dev/tty.)
   */
  type = uv_guess_handle(fd);
  if (type == UV_FILE || type == UV_UNKNOWN_HANDLE)
    return UV_EINVAL;

  /* Save the fd flags in case we need to restore them due to an error. */
  do
    saved_flags = fcntl(fd, F_GETFL);
  while (saved_flags == -1 && errno == EINTR);

  if (saved_flags == -1)
    return UV__ERR(errno);
  mode = saved_flags & O_ACCMODE;

  /* Reopen the file descriptor when it refers to a tty. This lets us put the
   * tty in non-blocking mode without affecting other processes that share it
   * with us.
   *
   * Example: `node | cat` - if we put our fd 0 in non-blocking mode, it also
   * affects fd 1 of `cat` because both file descriptors refer to the same
   * struct file in the kernel. When we reopen our fd 0, it points to a
   * different struct file, hence changing its properties doesn't affect
   * other processes.
   */
  if (type == UV_TTY) {
    /* Reopening a pty in master mode won't work either because the reopened
     * pty will be in slave mode (*BSD) or reopening will allocate a new
     * master/slave pair (Linux). Therefore check if the fd points to a
     * slave device.
     */
    if (uv__tty_is_slave(fd) && ttyname_r(fd, path, sizeof(path)) == 0)
      r = uv__open_cloexec(path, mode | O_NOCTTY);
    else
      r = -1;

    if (r < 0) {
      /* fallback to using blocking writes */
      if (mode != O_RDONLY)
        flags |= UV_HANDLE_BLOCKING_WRITES;
      goto skip;
    }

    newfd = r;

    r = uv__dup2_cloexec(newfd, fd);
    if (r < 0 && r != UV_EINVAL) {
      /* EINVAL means newfd == fd which could conceivably happen if another
       * thread called close(fd) between our calls to isatty() and open().
       * That's a rather unlikely event but let's handle it anyway.
       */
      uv__close(newfd);
      return r;
    }

    fd = newfd;
  }

skip:
  uv__stream_init(loop, (uv_stream_t*) tty, UV_TTY);

  /* If anything fails beyond this point we need to remove the handle from
   * the handle queue, since it was added by uv__handle_init in uv_stream_init.
   */

  if (!(flags & UV_HANDLE_BLOCKING_WRITES))
    uv__nonblock(fd, 1);

#if defined(__APPLE__)
  r = uv__stream_try_select((uv_stream_t*) tty, &fd);
  if (r) {
    int rc = r;
    if (newfd != -1)
      uv__close(newfd);
    QUEUE_REMOVE(&tty->handle_queue);
    do
      r = fcntl(fd, F_SETFL, saved_flags);
    while (r == -1 && errno == EINTR);
    return rc;
  }
#endif

  if (mode != O_WRONLY)
    flags |= UV_HANDLE_READABLE;
  if (mode != O_RDONLY)
    flags |= UV_HANDLE_WRITABLE;

  uv__stream_open((uv_stream_t*) tty, fd, flags);
  tty->mode = UV_TTY_MODE_NORMAL;

  return 0;
}